

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typemapper.hpp
# Opt level: O2

MethodHandle * __thiscall
jsonrpccxx::GetHandle<WarehouseServer,bool,Product_const&>
          (MethodHandle *__return_storage_ptr__,jsonrpccxx *this,
          offset_in_WarehouseServer_to_subr method,WarehouseServer *instance)

{
  function<bool_(const_Product_&)> *f;
  function<bool_(const_Product_&)> function;
  function<bool_(const_Product_&)> fStack_68;
  function<bool_(const_Product_&)> local_48;
  anon_class_24_2_b747b145 local_28;
  
  local_28.instance = instance;
  local_28.method = (offset_in_WarehouseServer_to_subr)this;
  local_28._16_8_ = method;
  std::function<bool(Product_const&)>::
  function<jsonrpccxx::GetHandle<WarehouseServer,bool,Product_const&>(bool(WarehouseServer::*)(Product_const&),WarehouseServer&)::_lambda(Product_const&)_1_,void>
            ((function<bool(Product_const&)> *)&local_48,&local_28);
  std::function<bool_(const_Product_&)>::function(&fStack_68,&local_48);
  GetHandle<bool,Product_const&>(__return_storage_ptr__,(jsonrpccxx *)&fStack_68,f);
  std::_Function_base::~_Function_base(&fStack_68.super__Function_base);
  std::_Function_base::~_Function_base(&local_48.super__Function_base);
  return __return_storage_ptr__;
}

Assistant:

MethodHandle GetHandle(ReturnType (T::*method)(ParamTypes...), T &instance) {
    std::function<ReturnType(ParamTypes...)> function = [&instance, method](ParamTypes &&... params) -> ReturnType {
      return (instance.*method)(std::forward<ParamTypes>(params)...);
    };
    return GetHandle(function);
  }